

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix.c
# Opt level: O2

void CRadix(LPPSTR a,UINT n)

{
  int *piVar1;
  byte bVar2;
  int d;
  uchar *puVar3;
  LPSTR puVar4;
  LPPSTR ta;
  LPBYTE __ptr;
  Stack *pSVar5;
  ulong uVar6;
  UINT i;
  long lVar7;
  ulong *puVar8;
  LPPSTR ppuVar9;
  ulong uVar10;
  uchar **a_00;
  byte *pbVar11;
  ulong uVar12;
  UINT UVar13;
  byte *__src;
  ulong uVar14;
  bool bVar15;
  UINT count [256];
  LPPSTR GrpKP [256];
  LPSTR GrpKB [256];
  
  ta = (LPPSTR)malloc(n * 8);
  __ptr = (LPBYTE)malloc(n * 4);
  sp->sa = a;
  sp->sk = __ptr;
  sp->sn = (int)n;
  pSVar5 = sp + 1;
  piVar1 = &sp->sb;
  sp = pSVar5;
  *piVar1 = 0;
  for (lVar7 = 0; lVar7 != 0xff; lVar7 = lVar7 + 1) {
    count[lVar7] = 0;
  }
LAB_0022180e:
  do {
    if (pSVar5 < (Stack *)((long)&stack[0].sa + 1)) {
      free(ta);
      free(__ptr);
      return;
    }
    sp = pSVar5 + -1;
    a_00 = pSVar5[-1].sa;
    __src = pSVar5[-1].sk;
    uVar14 = (ulong)pSVar5[-1].sn;
    d = pSVar5[-1].sb;
    UVar13 = (UINT)d;
    if (__src != (byte *)0x0) {
      uVar6 = UVar13 & 3;
      if (uVar6 != 0) {
        uVar10 = uVar14;
        pbVar11 = __src;
        while (bVar15 = uVar10 != 0, uVar10 = uVar10 - 1, bVar15) {
          count[*pbVar11] = count[*pbVar11] + 1;
          pbVar11 = pbVar11 + (4 - uVar6);
        }
LAB_002218be:
        puVar8 = count;
        do {
          uVar10 = *puVar8;
          puVar8 = puVar8 + 1;
        } while (uVar10 == 0);
        uVar12 = 0;
        if (uVar10 < uVar14) {
          uVar12 = uVar14;
        }
        uVar10 = uVar6 ^ 3;
        GrpKP[0] = a_00;
        GrpKB[0] = __src;
        pbVar11 = __src;
        ppuVar9 = a_00;
        for (lVar7 = 0; lVar7 != 0xff; lVar7 = lVar7 + 1) {
          UVar13 = count[lVar7];
          ppuVar9 = ppuVar9 + UVar13;
          GrpKP[lVar7 + 1] = ppuVar9;
          pbVar11 = pbVar11 + UVar13 * uVar10;
          GrpKB[lVar7 + 1] = pbVar11;
        }
        lVar7 = 4 - uVar6;
        memcpy(ta,a_00,uVar12 * 8);
        pbVar11 = __src;
        for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
          *GrpKP[*pbVar11] = ta[uVar6];
          GrpKP[*pbVar11] = GrpKP[*pbVar11] + 1;
          pbVar11 = pbVar11 + lVar7;
        }
        memcpy(ta,__src,lVar7 * uVar14);
        ppuVar9 = ta;
        for (uVar6 = 0; uVar6 != uVar14; uVar6 = uVar6 + 1) {
          bVar2 = *(byte *)ppuVar9;
          puVar4 = GrpKB[bVar2];
          for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
            puVar4[uVar12] = *(byte *)((long)ppuVar9 + uVar12 + 1);
          }
          ppuVar9 = (LPPSTR)((long)ppuVar9 + lVar7);
          GrpKB[bVar2] = puVar4 + uVar10;
        }
        lVar7 = 0;
        do {
          if (lVar7 != 0) {
            pSVar5 = sp;
            if (lVar7 == 0xff) goto LAB_0022180e;
            uVar14 = count[lVar7];
            if (uVar14 < 0x15) {
              if (1 < uVar14) {
                isort(a_00,(int)uVar14,d);
              }
            }
            else {
              sp->sa = a_00;
              sp->sk = __src;
              sp->sn = (int)uVar14;
              piVar1 = &sp->sb;
              sp = sp + 1;
              *piVar1 = d + 1;
            }
          }
          a_00 = a_00 + count[lVar7];
          __src = __src + count[lVar7] * uVar10;
          count[lVar7] = 0;
          lVar7 = lVar7 + 1;
        } while( true );
      }
      if (0x80 < (uint)pSVar5[-1].sn) {
        pbVar11 = __src;
        for (uVar10 = 0; uVar10 != uVar14; uVar10 = uVar10 + 1) {
          puVar3 = a_00[uVar10];
          count[puVar3[UVar13]] = count[puVar3[UVar13]] + 1;
          for (uVar12 = 0; (bVar2 = puVar3[uVar12 + UVar13], bVar2 != 0 && (uVar12 < 4));
              uVar12 = uVar12 + 1) {
            pbVar11[uVar12] = bVar2;
          }
          pbVar11 = pbVar11 + uVar12;
          if (uVar12 < 4) {
            *pbVar11 = 0;
            pbVar11 = pbVar11 + (4 - uVar12);
          }
        }
        goto LAB_002218be;
      }
    }
    RDFK(GrpKP,a_00,uVar14,ta,count,UVar13);
    pSVar5 = sp;
  } while( true );
}

Assistant:

void CRadix(LPPSTR a, UINT n)
{
	UINT kbsd, kbsd1, i, j, stage, d, MEMSIZE;
	UINT *cptr, gs, count[AS];
	LPSTR tj, tk, ax, tl, kb, ss, tt, GrpKB[AS];
	LPPSTR GrpKP[AS], ak, ta, tc, t;
	if (sizeof(LPPSTR)>sizeof(unsigned char)*BS)
		MEMSIZE=sizeof(LPPSTR);
	else
		MEMSIZE=sizeof(unsigned char)*BS;
	/* workspace */
	ta = (LPPSTR)malloc(n * MEMSIZE);
	/* memory for key buffers */
	tk = (LPBYTE)malloc(n * sizeof(unsigned char) * BS);
	tj=tk;
	push(a, tk, n, 0); for (i=AL; i<AH; i++) count[i]=0;
	while (!stackempty()) {
		pop(a, tk, n, stage);
		if (tk) {
			/* set the counters and
			   fill the key buffers if necessary */
			if ((d=stage%BS)!=0)
				for (i=0, tl=tk; i<n; i++, tl+=(BS-d))
					count[*tl]++;
			else {
				if (n>KBC)
					FillKeyBuffer(a, tk, count, n, stage);
				else {
					RDFK(GrpKP, a, n, ta, count, stage);
					continue;
				}
			}
			/* check if there is only 1 group */
			cptr=&count[AL];
			while (*cptr<1) cptr++;
			if (*cptr<n) gs=n; else gs=0;
			/* calculate both key ptr and
			   key buffer addresses */
			kbsd=BS-d, kbsd1=kbsd-1;
			GrpKP[AL]=a; GrpKB[AL]=tk;
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				GrpKP[i+1]=ak+=count[i];
				GrpKB[i+1]=ax+=count[i]*kbsd1;
			}

			/* permute the key ptrs */
			memcpy(ta, a, sizeof(LPSTR)*gs);
			for (i=0, ax=tk, tc=ta; i<gs;
					i++, ax+=kbsd, tc++) {
				*GrpKP[*ax]=*tc; GrpKP[*ax]++;
			}
			/* permute the key buffers */
			memcpy(ta, tk, sizeof(unsigned char)*n*kbsd);
			for (i=0, kb=(LPBYTE)ta; i<n; i++, *t+=kbsd1) {
				t=&GrpKB[*kb]; ss=*t; tt=kb+1;
				for (j=0; j<kbsd1; j++)
				{ *ss=*tt; ss++; tt++; }
				kb+=kbsd;
			}
			/* down 1 level */
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				if (splittable(i))
				{ push(ak, ax, count[i], stage+1); }
				else if (count[i]>1 && i>0)
					isort(ak, count[i], stage);
				ak+=count[i]; ax+=count[i]*(kbsd1);
				count[i]=0;
			}
		}
		else RDFK(GrpKP, a, n, ta, count, stage);
	}
	free((void*)ta);
	free((void*)tj);
}